

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

base_learner * warm_cb_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<float> *ptVar3;
  typed_option<unsigned_int> *ptVar4;
  typed_option<int> *ptVar5;
  uint64_t uVar6;
  base_learner *l;
  multi_learner *base;
  ostream *poVar7;
  learner<warm_cb,_example> *plVar8;
  vw_exception *this;
  float fVar9;
  float fVar10;
  bool use_cs;
  free_ptr<warm_cb> data;
  allocator local_eca;
  allocator local_ec9;
  allocator local_ec8;
  allocator local_ec7;
  allocator local_ec6;
  allocator local_ec5;
  allocator local_ec4;
  allocator local_ec3;
  allocator local_ec2;
  allocator local_ec1;
  allocator local_ec0;
  allocator local_ebf;
  allocator local_ebe;
  allocator local_ebd;
  allocator local_ebc;
  allocator local_ebb;
  allocator local_eba;
  allocator local_eb9;
  allocator local_eb8;
  allocator local_eb7;
  allocator local_eb6;
  allocator local_eb5;
  allocator local_eb4;
  allocator local_eb3;
  allocator local_eb2;
  allocator local_eb1;
  allocator local_eb0;
  allocator local_eaf;
  allocator local_eae;
  allocator local_ead;
  uint32_t num_actions;
  undefined1 local_ea8 [160];
  string local_e08 [32];
  string local_de8;
  string local_dc8 [32];
  string local_da8;
  string local_d88 [32];
  string local_d68;
  string local_d48 [32];
  string local_d28;
  string local_d08 [32];
  string local_ce8;
  string local_cc8 [32];
  string local_ca8;
  string local_c88 [32];
  string local_c68;
  string local_c48 [32];
  string local_c28;
  string local_c08 [32];
  string local_be8;
  string local_bc8 [32];
  string local_ba8;
  string local_b88 [32];
  string local_b68;
  string local_b48 [32];
  string local_b28;
  string local_b08 [32];
  string local_ae8;
  string local_ac8 [32];
  string local_aa8;
  string local_a88 [32];
  string local_a68;
  string local_a48;
  stringstream __msg;
  undefined1 local_a18 [96];
  bool local_9b8;
  string local_8a0;
  option_group_definition new_options;
  typed_option<float> local_848;
  undefined1 local_7a8 [112];
  bool local_738;
  typed_option<float> local_708;
  undefined1 local_668 [160];
  undefined1 local_5c8 [160];
  undefined1 local_528 [160];
  typed_option<unsigned_int> local_488;
  typed_option<int> local_3e8;
  typed_option<unsigned_int> local_348;
  typed_option<float> local_2a8;
  typed_option<int> local_208;
  typed_option<unsigned_int> local_168;
  typed_option<unsigned_int> local_c8;
  
  num_actions = 0;
  scoped_calloc_or_throw<warm_cb>();
  std::__cxx11::string::string
            ((string *)&local_a48,"Make Multiclass into Warm-starting Contextual Bandit",
             (allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_a48);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::string((string *)&local_a68,"warm_cb",&local_ead);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_a68,&num_actions);
  local_9b8 = true;
  std::__cxx11::string::string
            (local_a88,"Convert multiclass on <k> classes into a contextual bandit problem",
             &local_eae);
  std::__cxx11::string::_M_assign((string *)(local_a18 + 0x20));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&new_options,(typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::string((string *)&local_aa8,"warm_cb_cs",&local_eaf);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_ea8,&local_aa8,&use_cs);
  std::__cxx11::string::string
            (local_ac8,"consume cost-sensitive classification examples instead of multiclass",
             &local_eb0);
  std::__cxx11::string::_M_assign((string *)(local_ea8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_ea8);
  std::__cxx11::string::string((string *)&local_ae8,"loss0",&local_eb1);
  VW::config::typed_option<float>::typed_option
            (&local_848,&local_ae8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss0);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_848,0.0);
  std::__cxx11::string::string(local_b08,"loss for correct label",&local_eb2);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_b28,"loss1",&local_eb3);
  VW::config::typed_option<float>::typed_option
            (&local_708,&local_b28,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss1);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_708,1.0);
  std::__cxx11::string::string(local_b48,"loss for incorrect label",&local_eb4);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_b68,"warm_start",&local_eb5);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c8,&local_b68,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->ws_period);
  ptVar4 = VW::config::typed_option<unsigned_int>::default_value(&local_c8,0);
  std::__cxx11::string::string
            (local_b88,"number of training examples for warm start phase",&local_eb6);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar2,ptVar4);
  std::__cxx11::string::string((string *)&local_ba8,"epsilon",&local_eb7);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_7a8,&local_ba8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->epsilon);
  local_738 = true;
  std::__cxx11::string::string(local_bc8,"epsilon-greedy exploration",&local_eb8);
  std::__cxx11::string::_M_assign((string *)(local_7a8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar2,(typed_option<float> *)local_7a8);
  std::__cxx11::string::string((string *)&local_be8,"interaction",&local_eb9);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_168,&local_be8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->inter_period);
  ptVar4 = VW::config::typed_option<unsigned_int>::default_value(&local_168,0xffffffff);
  std::__cxx11::string::string
            (local_c08,"number of examples for the interactive contextual bandit learning phase",
             &local_eba);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar2,ptVar4);
  std::__cxx11::string::string((string *)&local_c28,"warm_start_update",&local_ebb);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_528,&local_c28,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->upd_ws);
  std::__cxx11::string::string(local_c48,"indicator of warm start updates",&local_ebc);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_528);
  std::__cxx11::string::string((string *)&local_c68,"interaction_update",&local_ebd);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5c8,&local_c68,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->upd_inter);
  std::__cxx11::string::string(local_c88,"indicator of interaction updates",&local_ebe);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_5c8);
  std::__cxx11::string::string((string *)&local_ca8,"corrupt_type_warm_start",&local_ebf);
  VW::config::typed_option<int>::typed_option
            (&local_208,&local_ca8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->cor_type_ws);
  ptVar5 = VW::config::typed_option<int>::default_value(&local_208,1);
  std::__cxx11::string::string
            (local_cc8,
             "type of label corruption in the warm start phase (1: uniformly at random, 2: circular, 3: replacing with overwriting label)"
             ,&local_ec0);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar2,ptVar5);
  std::__cxx11::string::string((string *)&local_ce8,"corrupt_prob_warm_start",&local_ec1);
  VW::config::typed_option<float>::typed_option
            (&local_2a8,&local_ce8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->cor_prob_ws);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_2a8,0.0);
  std::__cxx11::string::string
            (local_d08,"probability of label corruption in the warm start phase",&local_ec2);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_d28,"choices_lambda",&local_ec3);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_348,&local_d28,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->choices_lambda);
  ptVar4 = VW::config::typed_option<unsigned_int>::default_value(&local_348,1);
  std::__cxx11::string::string
            (local_d48,
             "the number of candidate lambdas to aggregate (lambda is the importance weight parameter between the two sources)"
             ,&local_ec4);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar2,ptVar4);
  std::__cxx11::string::string((string *)&local_d68,"lambda_scheme",&local_ec5);
  VW::config::typed_option<int>::typed_option
            (&local_3e8,&local_d68,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->lambda_scheme);
  ptVar5 = VW::config::typed_option<int>::default_value(&local_3e8,1);
  std::__cxx11::string::string
            (local_d88,
             "The scheme for generating candidate lambda set (1: center lambda=0.5, 2: center lambda=0.5, min lambda=0, max lambda=1, 3: center lambda=epsilon/(1+epsilon), 4: center lambda=epsilon/(1+epsilon), min lambda=0, max lambda=1); the rest of candidate lambda values are generated using a doubling scheme"
             ,&local_ec6);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar2,ptVar5);
  std::__cxx11::string::string((string *)&local_da8,"overwrite_label",&local_ec7);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_488,&local_da8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->overwrite_label);
  ptVar4 = VW::config::typed_option<unsigned_int>::default_value(&local_488,1);
  std::__cxx11::string::string
            (local_dc8,"the label used by type 3 corruptions (overwriting)",&local_ec8);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar2,ptVar4);
  std::__cxx11::string::string((string *)&local_de8,"sim_bandit",&local_ec9);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_668,&local_de8,
             &(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->sim_bandit);
  std::__cxx11::string::string
            (local_e08,"simulate contextual bandit updates on warm start examples",&local_eca);
  std::__cxx11::string::_M_assign((string *)(local_668 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar2,(typed_option<bool> *)local_668);
  std::__cxx11::string::~string(local_e08);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_668);
  std::__cxx11::string::~string((string *)&local_de8);
  std::__cxx11::string::~string(local_dc8);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_488);
  std::__cxx11::string::~string((string *)&local_da8);
  std::__cxx11::string::~string(local_d88);
  VW::config::typed_option<int>::~typed_option(&local_3e8);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string(local_d48);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string(local_d08);
  VW::config::typed_option<float>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string(local_cc8);
  VW::config::typed_option<int>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string(local_c88);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5c8);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string(local_c48);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_528);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string(local_c08);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string(local_bc8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_7a8);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string(local_b88);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string(local_b48);
  VW::config::typed_option<float>::~typed_option(&local_708);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string(local_b08);
  VW::config::typed_option<float>::~typed_option(&local_848);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string(local_ac8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_ea8);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string(local_a88);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_a68);
  (**options->_vptr_options_i)(options,&new_options);
  if (use_cs == true) {
    std::__cxx11::string::string((string *)&__msg,"corrupt_type_warm_start",(allocator *)&local_848)
    ;
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string
                ((string *)local_ea8,"corrupt_prob_warm_start",(allocator *)&local_708);
      iVar1 = (*options->_vptr_options_i[1])(options,local_ea8);
      std::__cxx11::string::~string((string *)local_ea8);
      std::__cxx11::string::~string((string *)&__msg);
      if ((char)iVar1 == '\0') goto LAB_001aa0f4;
    }
    else {
      std::__cxx11::string::~string((string *)&__msg);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_a18,
                    "label corruption on cost-sensitive examples not currently supported");
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
               ,0x259,&local_8a0);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
LAB_001aa0f4:
  std::__cxx11::string::string((string *)&__msg,"warm_cb",(allocator *)local_ea8);
  iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar1 == '\0') {
    plVar8 = (learner<warm_cb,_example> *)0x0;
  }
  else {
    uVar6 = uniform_hash("vw",2,0);
    (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
    _M_head_impl)->app_seed = uVar6;
    ((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
     _M_head_impl)->a_s)._begin = (action_score *)0x0;
    ((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
     _M_head_impl)->a_s)._end = (action_score *)0x0;
    ((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
     _M_head_impl)->a_s).end_array = (action_score *)0x0;
    ((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
     _M_head_impl)->a_s).erase_count = 0;
    (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
    _M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
    _M_head_impl)->use_cs = use_cs;
    init_adf_data(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl,(ulong)num_actions);
    std::__cxx11::string::string((string *)&__msg,"cb_min_cost",(allocator *)&local_848);
    std::__cxx11::to_string
              ((string *)local_ea8,
               (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss0);
    (*options->_vptr_options_i[5])(options,&__msg,local_ea8);
    std::__cxx11::string::~string((string *)local_ea8);
    std::__cxx11::string::~string((string *)&__msg);
    std::__cxx11::string::string((string *)&__msg,"cb_max_cost",(allocator *)&local_848);
    std::__cxx11::to_string
              ((string *)local_ea8,
               (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss1);
    (*options->_vptr_options_i[5])(options,&__msg,local_ea8);
    std::__cxx11::string::~string((string *)local_ea8);
    std::__cxx11::string::~string((string *)&__msg);
    std::__cxx11::string::string((string *)&__msg,"baseline",(allocator *)local_ea8);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      fVar10 = ABS((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss0);
      fVar9 = ABS((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss1);
      if (fVar9 <= fVar10) {
        fVar9 = fVar10;
      }
      std::ostream::operator<<
                (local_a18,
                 fVar9 / ((data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss1 -
                         (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->loss0));
      std::__cxx11::string::string((string *)local_ea8,"lr_multiplier",(allocator *)&local_708);
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_ea8,&local_848);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)local_ea8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&__msg);
    }
    l = setup_base(options,all);
    base = LEARNER::as_multiline<char,char>(l);
    std::__cxx11::string::string((string *)&__msg,"epsilon",(allocator *)local_ea8);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 == '\0') {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Warning: no epsilon (greedy parameter) specified; resetting to 0.05"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      (data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.super__Head_base<0UL,_warm_cb_*,_false>.
      _M_head_impl)->epsilon = 0.05;
    }
    if (use_cs == true) {
      plVar8 = LEARNER::
               init_cost_sensitive_learner<warm_cb,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                         (&data,base,predict_or_learn_adf<true,true>,
                          predict_or_learn_adf<false,true>,all->p,
                          (ulong)(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->
                                 choices_lambda,multiclass);
    }
    else {
      plVar8 = LEARNER::
               init_multiclass_learner<warm_cb,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                         (&data,base,predict_or_learn_adf<true,false>,
                          predict_or_learn_adf<false,false>,all->p,
                          (ulong)(data._M_t.super___uniq_ptr_impl<warm_cb,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_warm_cb_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_warm_cb_*,_false>._M_head_impl)->
                                 choices_lambda,multiclass);
    }
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = finish;
    all->delete_prediction = (_func_void_void_ptr *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar8;
}

Assistant:

base_learner* warm_cb_setup(options_i& options, vw& all)
{
  uint32_t num_actions=0;
  auto data = scoped_calloc_or_throw<warm_cb>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Warm-starting Contextual Bandit");

  new_options
      .add(make_option("warm_cb", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("warm_cb_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"))
      .add(make_option("warm_start", data->ws_period).default_value(0U).help("number of training examples for warm start phase"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("interaction", data->inter_period).default_value(UINT32_MAX).help("number of examples for the interactive contextual bandit learning phase"))
      .add(make_option("warm_start_update", data->upd_ws).help("indicator of warm start updates"))
      .add(make_option("interaction_update", data->upd_inter).help("indicator of interaction updates"))
      .add(make_option("corrupt_type_warm_start", data->cor_type_ws).default_value(UAR).help("type of label corruption in the warm start phase (1: uniformly at random, 2: circular, 3: replacing with overwriting label)"))
      .add(make_option("corrupt_prob_warm_start", data->cor_prob_ws).default_value(0.f).help("probability of label corruption in the warm start phase"))
      .add(make_option("choices_lambda", data->choices_lambda).default_value(1U).help("the number of candidate lambdas to aggregate (lambda is the importance weight parameter between the two sources)"))
      .add(make_option("lambda_scheme", data->lambda_scheme).default_value(ABS_CENTRAL).help("The scheme for generating candidate lambda set (1: center lambda=0.5, 2: center lambda=0.5, min lambda=0, max lambda=1, 3: center lambda=epsilon/(1+epsilon), 4: center lambda=epsilon/(1+epsilon), min lambda=0, max lambda=1); the rest of candidate lambda values are generated using a doubling scheme"))
      .add(make_option("overwrite_label", data->overwrite_label).default_value(1U).help("the label used by type 3 corruptions (overwriting)"))
      .add(make_option("sim_bandit", data->sim_bandit).help("simulate contextual bandit updates on warm start examples"));

  options.add_and_parse(new_options);

  if( use_cs && ( options.was_supplied("corrupt_type_warm_start") || options.was_supplied("corrupt_prob_warm_start") ) )
  {
    THROW("label corruption on cost-sensitive examples not currently supported");
  }


  if(!options.was_supplied("warm_cb"))
  {
    return nullptr;
  }

  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;
	data->use_cs = use_cs;

  init_adf_data(*data.get(), num_actions);

  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<warm_cb,example>* l;

  multi_learner* base = as_multiline(setup_base(options, all));
	// Note: the current version of warm start CB can only support epsilon-greedy exploration
	// We need to wait for the epsilon value to be passed from the base
  // cb_explore learner, if there is one


  if (!options.was_supplied("epsilon"))
  {
    cerr<<"Warning: no epsilon (greedy parameter) specified; resetting to 0.05"<<endl;
    data->epsilon = 0.05f;
  }

  if (use_cs)
    l = &init_cost_sensitive_learner(data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, data->choices_lambda);
  else
    l = &init_multiclass_learner(data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, data->choices_lambda);

  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}